

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exception.hpp
# Opt level: O1

void __thiscall jsoncons::not_an_object::~not_an_object(not_an_object *this,void **vtt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  void *pvVar2;
  pointer pcVar3;
  
  pvVar2 = *vtt;
  *(void **)this = pvVar2;
  *(void **)(&this->super_runtime_error + *(long *)((long)pvVar2 + -0x18)) = vtt[1];
  pcVar3 = (this->what_)._M_dataplus._M_p;
  paVar1 = &(this->what_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->name_)._M_dataplus._M_p;
  paVar1 = &(this->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

const char* what() const noexcept override
        {
            if (what_.empty())
            {
                JSONCONS_TRY
                {
                    what_.append(std::runtime_error::what());
                    what_.append(": '");
                    what_.append(name_);
                    what_.append("'");
                    return what_.c_str();
                }
                JSONCONS_CATCH(...)
                {
                    return std::runtime_error::what();
                }
            }